

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPMU_SYM_KEY_BITS_Marshal
                 (TPMU_SYM_KEY_BITS *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT16 UVar1;
  
  UVar1 = 0;
  if ((selector < 0xb) && ((0x448U >> (selector & 0x1f) & 1) != 0)) {
    UINT16_Marshal(&source->tdes,buffer,size);
    UVar1 = 2;
  }
  return UVar1;
}

Assistant:

UINT16
TPMU_SYM_KEY_BITS_Marshal(TPMU_SYM_KEY_BITS *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_TDES
        case TPM_ALG_TDES:
            return TPMI_TDES_KEY_BITS_Marshal((TPMI_TDES_KEY_BITS *)&(source->tdes), buffer, size);
#endif // ALG_TDES
#if         ALG_AES
        case TPM_ALG_AES:
            return TPMI_AES_KEY_BITS_Marshal((TPMI_AES_KEY_BITS *)&(source->aes), buffer, size);
#endif // ALG_AES
#if         ALG_SM4
        case TPM_ALG_SM4:
            return TPMI_SM4_KEY_BITS_Marshal((TPMI_SM4_KEY_BITS *)&(source->sm4), buffer, size);
#endif // ALG_SM4
#if         ALG_CAMELLIA
        case TPM_ALG_CAMELLIA:
            return TPMI_CAMELLIA_KEY_BITS_Marshal((TPMI_CAMELLIA_KEY_BITS *)&(source->camellia), buffer, size);
#endif // ALG_CAMELLIA
#if         ALG_XOR
        case TPM_ALG_XOR:
            return TPMI_ALG_HASH_Marshal((TPMI_ALG_HASH *)&(source->alg_xor), buffer, size);
#endif // ALG_XOR
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}